

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_do(connectdata **connp,_Bool *done)

{
  SessionHandle *pSVar1;
  SessionHandle *data;
  connectdata *conn;
  CURLcode result;
  _Bool *done_local;
  connectdata **connp_local;
  
  conn._4_4_ = CURLE_OK;
  data = (SessionHandle *)*connp;
  pSVar1 = data->next;
  if (((Curl_handler *)(data->set).convtonetwork)->do_it !=
      (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
    conn._4_4_ = (*((Curl_handler *)(data->set).convtonetwork)->do_it)((connectdata *)data,done);
    if ((conn._4_4_ == CURLE_SEND_ERROR) &&
       ((((ConnectBits *)&(data->set).fsockopt)->reuse & 1U) != 0)) {
      if (pSVar1->multi != (Curl_multi *)0x0) {
        return CURLE_SEND_ERROR;
      }
      conn._4_4_ = Curl_reconnect_request(connp);
      if (conn._4_4_ == CURLE_OK) {
        data = (SessionHandle *)*connp;
        conn._4_4_ = (*((Curl_handler *)(data->set).convtonetwork)->do_it)((connectdata *)data,done)
        ;
      }
    }
    if ((conn._4_4_ == CURLE_OK) && ((*done & 1U) != 0)) {
      do_complete((connectdata *)data);
    }
  }
  return conn._4_4_;
}

Assistant:

CURLcode Curl_do(struct connectdata **connp, bool *done)
{
  CURLcode result=CURLE_OK;
  struct connectdata *conn = *connp;
  struct SessionHandle *data = conn->data;

  if(conn->handler->do_it) {
    /* generic protocol-specific function pointer set in curl_connect() */
    result = conn->handler->do_it(conn, done);

    /* This was formerly done in transfer.c, but we better do it here */
    if((CURLE_SEND_ERROR == result) && conn->bits.reuse) {
      /*
       * If the connection is using an easy handle, call reconnect
       * to re-establish the connection.  Otherwise, let the multi logic
       * figure out how to re-establish the connection.
       */
      if(!data->multi) {
        result = Curl_reconnect_request(connp);

        if(!result) {
          /* ... finally back to actually retry the DO phase */
          conn = *connp; /* re-assign conn since Curl_reconnect_request
                            creates a new connection */
          result = conn->handler->do_it(conn, done);
        }
      }
      else
        return result;
    }

    if(!result && *done)
      /* do_complete must be called after the protocol-specific DO function */
      do_complete(conn);
  }
  return result;
}